

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

bool __thiscall
ON_SubDHeap::Internal_InitializeFragmentCountEstimates(ON_SubDHeap *this,uint subd_display_density)

{
  bool bVar1;
  bool local_59;
  uint local_58;
  uint local_54;
  ON_SubDFace *f;
  void *p;
  ON_FixedSizePoolIterator fspfit;
  uint part_frag_count;
  uint full_frag_count;
  uint subd_face_count;
  uint subd_display_density_local;
  ON_SubDHeap *this_local;
  
  if (this->m_full_fragment_display_density == 0) {
    if (subd_display_density == 0) {
      local_58 = 1;
    }
    else {
      local_54 = subd_display_density;
      if (6 < subd_display_density) {
        local_54 = 6;
      }
      local_58 = local_54;
    }
    this->m_full_fragment_display_density = local_58;
    fspfit.m_it_element._4_4_ = 0;
    fspfit.m_it_element._0_4_ = 0;
    ON_FixedSizePoolIterator::ON_FixedSizePoolIterator((ON_FixedSizePoolIterator *)&p,&this->m_fspf)
    ;
    f = (ON_SubDFace *)ON_FixedSizePoolIterator::FirstElement((ON_FixedSizePoolIterator *)&p);
    while (f != (ON_SubDFace *)0x0) {
      bVar1 = ON_SubDComponentBase::IsActive(&f->super_ON_SubDComponentBase);
      if (bVar1) {
        if (f->m_edge_count == 4) {
          fspfit.m_it_element._4_4_ = fspfit.m_it_element._4_4_ + 1;
        }
        else {
          fspfit.m_it_element._0_4_ = f->m_edge_count + (uint)fspfit.m_it_element;
        }
      }
      f = (ON_SubDFace *)ON_FixedSizePoolIterator::NextElement((ON_FixedSizePoolIterator *)&p);
    }
    if ((fspfit.m_it_element._4_4_ == 0) && ((uint)fspfit.m_it_element == 0)) {
      this->m_full_fragment_count_estimate = 0;
      this->m_part_fragment_count_estimate = 0;
    }
    else {
      this->m_full_fragment_count_estimate = fspfit.m_it_element._4_4_;
      this->m_part_fragment_count_estimate = (uint)fspfit.m_it_element;
    }
  }
  local_59 = false;
  if (this->m_full_fragment_display_density != 0) {
    local_59 = this->m_full_fragment_display_density < 7;
  }
  return local_59;
}

Assistant:

bool ON_SubDHeap::Internal_InitializeFragmentCountEstimates(
  unsigned subd_display_density
)
{
  if (0 == m_full_fragment_display_density)
  {
    m_full_fragment_display_density 
      = subd_display_density > 0 
      ? (subd_display_density <= ON_SubDDisplayParameters::MaximumDensity ? subd_display_density : ON_SubDDisplayParameters::MaximumDensity)
      : 1U
      ;

    // Count the number of active faces and fragments needed to mesh them
    unsigned subd_face_count = 0;
    unsigned full_frag_count = 0;
    unsigned part_frag_count = 0;

    ON_FixedSizePoolIterator fspfit(m_fspf);
    for (const void* p = fspfit.FirstElement(); nullptr != p; p = fspfit.NextElement())
    {
      const ON_SubDFace* f = (const ON_SubDFace*)p;
      if (false == f->IsActive())
        continue;
      ++subd_face_count;
      if (4 == f->m_edge_count)
        ++full_frag_count; // one full fragment per quad
      else
        part_frag_count += f->m_edge_count; // n partial fragments per n-gon when n != 4
    }

    if (full_frag_count > 0 || part_frag_count > 0)
    {
      m_full_fragment_count_estimate = full_frag_count;
      m_part_fragment_count_estimate = part_frag_count;
    }
    else
    {
      m_full_fragment_count_estimate = 0;
      m_part_fragment_count_estimate = 0;
    }
  }

  return (m_full_fragment_display_density > 0 && m_full_fragment_display_density <= ON_SubDDisplayParameters::MaximumDensity);
}